

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O1

int Amap_ManMergeCountCuts(Amap_Man_t *p,Amap_Obj_t *pNode)

{
  void **ppvVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iFan1;
  int iVar7;
  int iFan0;
  uint *puVar8;
  int iVar9;
  uint *puVar10;
  
  if (pNode->Fan[0] < 0) {
LAB_00418aba:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar4 = (uint)pNode->Fan[0] >> 1;
  iVar7 = p->vObjs->nSize;
  if ((int)uVar4 < iVar7) {
    if (pNode->Fan[1] < 0) goto LAB_00418aba;
    uVar5 = (uint)pNode->Fan[1] >> 1;
    if ((int)uVar5 < iVar7) {
      ppvVar1 = p->vObjs->pArray;
      pvVar2 = ppvVar1[uVar4];
      if (*(int *)((long)pvVar2 + 0xc) < 1) {
        iVar7 = 1;
      }
      else {
        puVar8 = *(uint **)((long)pvVar2 + 0x28);
        pvVar3 = ppvVar1[uVar5];
        iVar6 = 0;
        iVar7 = 1;
        do {
          if (0 < *(int *)((long)pvVar3 + 0xc)) {
            puVar10 = *(uint **)((long)pvVar3 + 0x28);
            iVar9 = 0;
            do {
              if ((pNode->Fan[0] < 0) || (pNode->Fan[1] < 0)) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                              ,0x130,"int Abc_LitIsCompl(int)");
              }
              uVar4 = *puVar8 & 0xffff;
              if (uVar4 == 0) {
                iFan0 = 0;
              }
              else {
                iFan0 = ((*puVar8 >> 0x10 ^ pNode->Fan[0]) & 1) + uVar4 * 2;
              }
              uVar4 = *puVar10 & 0xffff;
              iFan1 = ((*puVar10 >> 0x10 ^ pNode->Fan[1]) & 1) + uVar4 * 2;
              if (uVar4 == 0) {
                iFan1 = 0;
              }
              uVar4 = Amap_LibFindNode(p->pLib,iFan0,iFan1,
                                       (uint)(((undefined1  [96])*pNode & (undefined1  [96])0x7) ==
                                             (undefined1  [96])0x5));
              iVar7 = iVar7 - ((int)~uVar4 >> 0x1f);
              iVar9 = iVar9 + 1;
              puVar10 = puVar10 + (ulong)(*puVar10 >> 0x11) + 1;
            } while (iVar9 < *(int *)((long)pvVar3 + 0xc));
          }
          iVar6 = iVar6 + 1;
          puVar8 = puVar8 + (ulong)(*puVar8 >> 0x11) + 1;
        } while (iVar6 < *(int *)((long)pvVar2 + 0xc));
      }
      return iVar7;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Amap_ManMergeCountCuts( Amap_Man_t * p, Amap_Obj_t * pNode )
{
    Amap_Obj_t * pFanin0 = Amap_ObjFanin0( p, pNode );
    Amap_Obj_t * pFanin1 = Amap_ObjFanin1( p, pNode );
    Amap_Cut_t * pCut0, * pCut1;
    int Entry, c0, c1, iCompl0, iCompl1, iFan0, iFan1;
    int Counter = 1;
    Amap_NodeForEachCut( pFanin0, pCut0, c0 )
    Amap_NodeForEachCut( pFanin1, pCut1, c1 )
    {
        iCompl0 = pCut0->fInv ^ Amap_ObjFaninC0(pNode);
        iCompl1 = pCut1->fInv ^ Amap_ObjFaninC1(pNode);
        iFan0   = !pCut0->iMat? 0: Abc_Var2Lit( pCut0->iMat, iCompl0 );
        iFan1   = !pCut1->iMat? 0: Abc_Var2Lit( pCut1->iMat, iCompl1 );
        Entry = Amap_LibFindNode( p->pLib, iFan0, iFan1, pNode->Type == AMAP_OBJ_XOR );
        Counter += ( Entry >=0 );
//        if ( Entry >=0 )
//            printf( "Full: %d + %d = %d\n", iFan0, iFan1, Entry );
    }
    return Counter;
}